

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O0

void Abc_FlowRetime_UpdateForwardInit_rec(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  int local_1c;
  int i;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjIsPi(pObj);
  if (iVar1 == 0) {
    iVar1 = Abc_ObjIsBo(pObj);
    if ((iVar1 == 0) && (iVar1 = Abc_NodeIsTravIdCurrent(pObj), iVar1 == 0)) {
      Abc_NodeSetTravIdCurrent(pObj);
      for (local_1c = 0; iVar1 = Abc_ObjFaninNum(pObj), local_1c < iVar1; local_1c = local_1c + 1) {
        pObj_00 = Abc_ObjFanin(pObj,local_1c);
        Abc_FlowRetime_UpdateForwardInit_rec(pObj_00);
      }
      Abc_FlowRetime_SimulateNode(pObj);
    }
    return;
  }
  __assert_fail("!Abc_ObjIsPi(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                ,0xbc,"void Abc_FlowRetime_UpdateForwardInit_rec(Abc_Obj_t *)");
}

Assistant:

void Abc_FlowRetime_UpdateForwardInit_rec( Abc_Obj_t * pObj ) {
  Abc_Obj_t *pNext;
  int i;

  assert(!Abc_ObjIsPi(pObj)); // should never reach the inputs

  if (Abc_ObjIsBo(pObj)) return;

  // visited?
  if (Abc_NodeIsTravIdCurrent(pObj)) return;
  Abc_NodeSetTravIdCurrent(pObj);

  Abc_ObjForEachFanin( pObj, pNext, i ) {
    Abc_FlowRetime_UpdateForwardInit_rec( pNext );
  }
  
  Abc_FlowRetime_SimulateNode( pObj );
}